

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateMeshShadingEXTBuiltinsAtDefinition
          (BuiltInsValidator *this,Decoration *decoration,Instruction *inst)

{
  ValidationState_t *this_00;
  Instruction *decoration_00;
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  spv_result_t sVar4;
  spv_const_context psVar5;
  DiagnosticStream *pDVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  reference puVar7;
  Instruction *pIVar8;
  size_type sVar9;
  string local_f70;
  DiagnosticStream local_f50;
  string local_d78;
  DiagnosticStream local_d58;
  key_type local_b7c;
  string local_b78;
  DiagnosticStream local_b58;
  string local_980;
  DiagnosticStream local_960;
  key_type local_784;
  string local_780;
  DiagnosticStream local_760;
  string local_588;
  DiagnosticStream local_568;
  key_type local_38c;
  uint64_t local_388;
  uint64_t primitiveArrayDim;
  spv_result_t error_4;
  uint32_t underlying_type;
  uint64_t maxOutputPrimitives;
  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_> *modes
  ;
  const_iterator cStack_360;
  uint32_t entry_point;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range3;
  DiagnosticStream local_328;
  anon_class_32_4_b2657a23 local_150;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_130;
  spv_result_t local_10c;
  undefined1 auStack_108 [4];
  spv_result_t error_3;
  Instruction *local_100;
  Instruction *local_f8;
  uint32_t *local_f0;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_e8;
  undefined4 local_c4;
  undefined1 auStack_c0 [4];
  spv_result_t error_2;
  Instruction *local_b8;
  Instruction *local_b0;
  uint32_t *local_a8;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a0;
  undefined4 local_7c;
  undefined1 auStack_78 [4];
  spv_result_t error_1;
  Instruction *local_70;
  Instruction *local_68;
  uint32_t *local_60;
  function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_58;
  undefined4 local_34;
  uint32_t local_30;
  spv_result_t error;
  uint32_t vuid;
  BuiltIn builtin;
  Instruction *inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  _vuid = inst;
  inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  psVar5 = ValidationState_t::context(this->_);
  bVar1 = spvIsVulkanEnv(psVar5->target_env);
  if (bVar1) {
    error = Decoration::builtin((Decoration *)inst_local);
    local_30 = GetVUIDForBuiltin(error,VUIDErrorType);
    decoration_00 = inst_local;
    pIVar8 = _vuid;
    switch(error) {
    case 0x14ae:
      local_70 = _vuid;
      local_68 = inst_local;
      local_60 = &local_30;
      _auStack_78 = this;
      std::function<spv_result_t(std::__cxx11::string_const&)>::
      function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidateMeshShadingEXTBuiltinsAtDefinition(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&)::__0,void>
                ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_58,
                 (anon_class_32_4_b2657a23 *)auStack_78);
      sVar4 = ValidateI32Arr(this,(Decoration *)decoration_00,pIVar8,&local_58);
      std::
      function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_58);
      if (sVar4 != SPV_SUCCESS) {
        return sVar4;
      }
      local_34 = 0;
      break;
    case 0x14af:
      local_b8 = _vuid;
      local_b0 = inst_local;
      local_a8 = &local_30;
      _auStack_c0 = this;
      std::function<spv_result_t(std::__cxx11::string_const&)>::
      function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidateMeshShadingEXTBuiltinsAtDefinition(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&)::__1,void>
                ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_a0,
                 (anon_class_32_4_b2657a23 *)auStack_c0);
      sVar4 = ValidateArrayedI32Vec(this,(Decoration *)decoration_00,pIVar8,2,&local_a0);
      std::
      function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_a0);
      if (sVar4 != SPV_SUCCESS) {
        return sVar4;
      }
      local_7c = 0;
      break;
    case 0x14b0:
      local_100 = _vuid;
      local_f8 = inst_local;
      local_f0 = &local_30;
      _auStack_108 = this;
      std::function<spv_result_t(std::__cxx11::string_const&)>::
      function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidateMeshShadingEXTBuiltinsAtDefinition(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&)::__2,void>
                ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_e8,
                 (anon_class_32_4_b2657a23 *)auStack_108);
      sVar4 = ValidateArrayedI32Vec(this,(Decoration *)decoration_00,pIVar8,3,&local_e8);
      std::
      function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_e8);
      if (sVar4 != SPV_SUCCESS) {
        return sVar4;
      }
      local_c4 = 0;
      break;
    default:
      __assert_fail("0 && \"Unexpected mesh EXT builtin\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_builtins.cpp"
                    ,0x1110,
                    "spv_result_t spvtools::val::(anonymous namespace)::BuiltInsValidator::ValidateMeshShadingEXTBuiltinsAtDefinition(const Decoration &, const Instruction &)"
                   );
    case 0x14b3:
      local_150.inst = _vuid;
      local_150.decoration = (Decoration *)inst_local;
      local_150.vuid = &local_30;
      local_150.this = this;
      std::function<spv_result_t(std::__cxx11::string_const&)>::
      function<spvtools::val::(anonymous_namespace)::BuiltInsValidator::ValidateMeshShadingEXTBuiltinsAtDefinition(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&)::__3,void>
                ((function<spv_result_t(std::__cxx11::string_const&)> *)&local_130,&local_150);
      sVar4 = ValidateBool(this,(Decoration *)decoration_00,pIVar8,&local_130);
      std::
      function<spv_result_t_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function(&local_130);
      if (sVar4 != SPV_SUCCESS) {
        return sVar4;
      }
      this_00 = this->_;
      local_10c = sVar4;
      uVar2 = val::Instruction::id(_vuid);
      bVar1 = ValidationState_t::HasDecoration(this_00,uVar2,DecorationPerPrimitiveEXT);
      if (!bVar1) {
        ValidationState_t::diag(&local_328,this->_,SPV_ERROR_INVALID_DATA,_vuid);
        ValidationState_t::VkErrorID_abi_cxx11_((string *)&__range3,this->_,0x1b7e,(char *)0x0);
        pDVar6 = DiagnosticStream::operator<<
                           (&local_328,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &__range3);
        pDVar6 = DiagnosticStream::operator<<
                           (pDVar6,(char (*) [140])
                                   "The variable decorated with CullPrimitiveEXT within the MeshEXT Execution Model must also be decorated with the PerPrimitiveEXT decoration "
                           );
        this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
        std::__cxx11::string::~string((string *)&__range3);
        DiagnosticStream::~DiagnosticStream(&local_328);
        return this_local._4_4_;
      }
    }
    this_01 = ValidationState_t::entry_points(this->_);
    __end3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_01);
    cStack_360 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffca0), bVar1) {
      puVar7 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end3);
      modes._4_4_ = *puVar7;
      maxOutputPrimitives = (uint64_t)ValidationState_t::GetExecutionModes(this->_,modes._4_4_);
      uVar2 = ValidationState_t::GetOutputPrimitivesEXT(this->_,modes._4_4_);
      _error_4 = (ulong)uVar2;
      primitiveArrayDim._4_4_ = 0;
      primitiveArrayDim._0_4_ =
           GetUnderlyingType(this->_,(Decoration *)inst_local,_vuid,
                             (uint32_t *)((long)&primitiveArrayDim + 4));
      if ((spv_result_t)primitiveArrayDim != SPV_SUCCESS) {
        return (spv_result_t)primitiveArrayDim;
      }
      local_388 = 0;
      OVar3 = ValidationState_t::GetIdOpcode(this->_,primitiveArrayDim._4_4_);
      if (OVar3 == OpTypeArray) {
        pIVar8 = ValidationState_t::FindDef(this->_,primitiveArrayDim._4_4_);
        primitiveArrayDim._4_4_ = val::Instruction::word(pIVar8,3);
        bVar1 = ValidationState_t::EvalConstantValUint64(this->_,primitiveArrayDim._4_4_,&local_388)
        ;
        if (!bVar1) {
          __assert_fail("0 && \"Array type definition is corrupt\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_builtins.cpp"
                        ,0x111f,
                        "spv_result_t spvtools::val::(anonymous namespace)::BuiltInsValidator::ValidateMeshShadingEXTBuiltinsAtDefinition(const Decoration &, const Instruction &)"
                       );
        }
      }
      if (error == 0x14ae) {
        bVar1 = true;
        if (maxOutputPrimitives != 0) {
          local_38c = ExecutionModeOutputPoints;
          sVar9 = std::
                  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                  ::count((set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                           *)maxOutputPrimitives,&local_38c);
          bVar1 = sVar9 == 0;
        }
        if (bVar1) {
          ValidationState_t::diag(&local_568,this->_,SPV_ERROR_INVALID_DATA,_vuid);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_588,this->_,0x1b82,(char *)0x0);
          pDVar6 = DiagnosticStream::operator<<(&local_568,&local_588);
          pDVar6 = DiagnosticStream::operator<<
                             (pDVar6,(char (*) [92])
                                     "The PrimitivePointIndicesEXT decoration must be used with the OutputPoints Execution Mode. "
                             );
          this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
          std::__cxx11::string::~string((string *)&local_588);
          DiagnosticStream::~DiagnosticStream(&local_568);
          return this_local._4_4_;
        }
        if ((local_388 != 0) && (local_388 != _error_4)) {
          ValidationState_t::diag(&local_760,this->_,SPV_ERROR_INVALID_DATA,_vuid);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_780,this->_,0x1b86,(char *)0x0);
          pDVar6 = DiagnosticStream::operator<<(&local_760,&local_780);
          pDVar6 = DiagnosticStream::operator<<
                             (pDVar6,(char (*) [118])
                                     "The size of the array decorated with PrimitivePointIndicesEXT must match the value specified by OutputPrimitivesEXT. "
                             );
          this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
          std::__cxx11::string::~string((string *)&local_780);
          DiagnosticStream::~DiagnosticStream(&local_760);
          return this_local._4_4_;
        }
      }
      else if (error == 0x14af) {
        bVar1 = true;
        if (maxOutputPrimitives != 0) {
          local_784 = ExecutionModeOutputLinesEXT;
          sVar9 = std::
                  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                  ::count((set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                           *)maxOutputPrimitives,&local_784);
          bVar1 = sVar9 == 0;
        }
        if (bVar1) {
          ValidationState_t::diag(&local_960,this->_,SPV_ERROR_INVALID_DATA,_vuid);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_980,this->_,0x1b88,(char *)0x0);
          pDVar6 = DiagnosticStream::operator<<(&local_960,&local_980);
          pDVar6 = DiagnosticStream::operator<<
                             (pDVar6,(char (*) [93])
                                     "The PrimitiveLineIndicesEXT decoration must be used with the OutputLinesEXT Execution Mode. "
                             );
          this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
          std::__cxx11::string::~string((string *)&local_980);
          DiagnosticStream::~DiagnosticStream(&local_960);
          return this_local._4_4_;
        }
        if ((local_388 != 0) && (local_388 != _error_4)) {
          ValidationState_t::diag(&local_b58,this->_,SPV_ERROR_INVALID_DATA,_vuid);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_b78,this->_,0x1b8c,(char *)0x0);
          pDVar6 = DiagnosticStream::operator<<(&local_b58,&local_b78);
          pDVar6 = DiagnosticStream::operator<<
                             (pDVar6,(char (*) [117])
                                     "The size of the array decorated with PrimitiveLineIndicesEXT must match the value specified by OutputPrimitivesEXT. "
                             );
          this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
          std::__cxx11::string::~string((string *)&local_b78);
          DiagnosticStream::~DiagnosticStream(&local_b58);
          return this_local._4_4_;
        }
      }
      else if (error == 0x14b0) {
        bVar1 = true;
        if (maxOutputPrimitives != 0) {
          local_b7c = ExecutionModeOutputTrianglesEXT;
          sVar9 = std::
                  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                  ::count((set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                           *)maxOutputPrimitives,&local_b7c);
          bVar1 = sVar9 == 0;
        }
        if (bVar1) {
          ValidationState_t::diag(&local_d58,this->_,SPV_ERROR_INVALID_DATA,_vuid);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_d78,this->_,0x1b8e,(char *)0x0);
          pDVar6 = DiagnosticStream::operator<<(&local_d58,&local_d78);
          pDVar6 = DiagnosticStream::operator<<
                             (pDVar6,(char (*) [101])
                                     "The PrimitiveTriangleIndicesEXT decoration must be used with the OutputTrianglesEXT Execution Mode. "
                             );
          this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
          std::__cxx11::string::~string((string *)&local_d78);
          DiagnosticStream::~DiagnosticStream(&local_d58);
          return this_local._4_4_;
        }
        if ((local_388 != 0) && (local_388 != _error_4)) {
          ValidationState_t::diag(&local_f50,this->_,SPV_ERROR_INVALID_DATA,_vuid);
          ValidationState_t::VkErrorID_abi_cxx11_(&local_f70,this->_,0x1b92,(char *)0x0);
          pDVar6 = DiagnosticStream::operator<<(&local_f50,&local_f70);
          pDVar6 = DiagnosticStream::operator<<
                             (pDVar6,(char (*) [121])
                                     "The size of the array decorated with PrimitiveTriangleIndicesEXT must match the value specified by OutputPrimitivesEXT. "
                             );
          this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar6);
          std::__cxx11::string::~string((string *)&local_f70);
          DiagnosticStream::~DiagnosticStream(&local_f50);
          return this_local._4_4_;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end3);
    }
  }
  sVar4 = ValidateMeshShadingEXTBuiltinsAtReference(this,(Decoration *)inst_local,_vuid,_vuid,_vuid)
  ;
  return sVar4;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateMeshShadingEXTBuiltinsAtDefinition(
    const Decoration& decoration, const Instruction& inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::BuiltIn builtin = decoration.builtin();
    uint32_t vuid = GetVUIDForBuiltin(builtin, VUIDErrorType);
    switch (builtin) {
      case spv::BuiltIn::PrimitivePointIndicesEXT:
        if (spv_result_t error = ValidateI32Arr(
                decoration, inst,
                [this, &inst, &decoration,
                 &vuid](const std::string& message) -> spv_result_t {
                  return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                         << _.VkErrorID(vuid) << "According to the "
                         << spvLogStringForEnv(_.context()->target_env)
                         << " spec BuiltIn "
                         << _.grammar().lookupOperandName(
                                SPV_OPERAND_TYPE_BUILT_IN,
                                (uint32_t)decoration.builtin())
                         << " variable needs to be a 32-bit int array."
                         << message;
                })) {
          return error;
        }
        break;
      case spv::BuiltIn::PrimitiveLineIndicesEXT:
        if (spv_result_t error = ValidateArrayedI32Vec(
                decoration, inst, 2,
                [this, &inst, &decoration,
                 &vuid](const std::string& message) -> spv_result_t {
                  return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                         << _.VkErrorID(vuid) << "According to the "
                         << spvLogStringForEnv(_.context()->target_env)
                         << " spec BuiltIn "
                         << _.grammar().lookupOperandName(
                                SPV_OPERAND_TYPE_BUILT_IN,
                                (uint32_t)decoration.builtin())
                         << " variable needs to be a 2-component 32-bit int "
                            "array."
                         << message;
                })) {
          return error;
        }
        break;
      case spv::BuiltIn::PrimitiveTriangleIndicesEXT:
        if (spv_result_t error = ValidateArrayedI32Vec(
                decoration, inst, 3,
                [this, &inst, &decoration,
                 &vuid](const std::string& message) -> spv_result_t {
                  return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                         << _.VkErrorID(vuid) << "According to the "
                         << spvLogStringForEnv(_.context()->target_env)
                         << " spec BuiltIn "
                         << _.grammar().lookupOperandName(
                                SPV_OPERAND_TYPE_BUILT_IN,
                                (uint32_t)decoration.builtin())
                         << " variable needs to be a 3-component 32-bit int "
                            "array."
                         << message;
                })) {
          return error;
        }
        break;
      case spv::BuiltIn::CullPrimitiveEXT:
        if (spv_result_t error = ValidateBool(
                decoration, inst,
                [this, &inst, &decoration,
                 &vuid](const std::string& message) -> spv_result_t {
                  return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                         << _.VkErrorID(vuid) << "According to the "
                         << spvLogStringForEnv(_.context()->target_env)
                         << " spec BuiltIn "
                         << _.grammar().lookupOperandName(
                                SPV_OPERAND_TYPE_BUILT_IN,
                                (uint32_t)decoration.builtin())
                         << " variable needs to be a boolean value "
                            "array."
                         << message;
                })) {
          return error;
        }
        if (!_.HasDecoration(inst.id(), spv::Decoration::PerPrimitiveEXT)) {
          return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                 << _.VkErrorID(7038)
                 << "The variable decorated with CullPrimitiveEXT within the "
                    "MeshEXT Execution Model must also be decorated with the "
                    "PerPrimitiveEXT decoration ";
        }
        break;
      default:
        assert(0 && "Unexpected mesh EXT builtin");
    }
    for (const uint32_t entry_point : _.entry_points()) {
      const auto* modes = _.GetExecutionModes(entry_point);
      uint64_t maxOutputPrimitives = _.GetOutputPrimitivesEXT(entry_point);
      uint32_t underlying_type = 0;
      if (spv_result_t error =
              GetUnderlyingType(_, decoration, inst, &underlying_type)) {
        return error;
      }

      uint64_t primitiveArrayDim = 0;
      if (_.GetIdOpcode(underlying_type) == spv::Op::OpTypeArray) {
        underlying_type = _.FindDef(underlying_type)->word(3u);
        if (!_.EvalConstantValUint64(underlying_type, &primitiveArrayDim)) {
          assert(0 && "Array type definition is corrupt");
        }
      }
      switch (builtin) {
        case spv::BuiltIn::PrimitivePointIndicesEXT:
          if (!modes || !modes->count(spv::ExecutionMode::OutputPoints)) {
            return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                   << _.VkErrorID(7042)
                   << "The PrimitivePointIndicesEXT decoration must be used "
                      "with "
                      "the OutputPoints Execution Mode. ";
          }
          if (primitiveArrayDim && primitiveArrayDim != maxOutputPrimitives) {
            return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                   << _.VkErrorID(7046)
                   << "The size of the array decorated with "
                      "PrimitivePointIndicesEXT must match the value specified "
                      "by OutputPrimitivesEXT. ";
          }
          break;
        case spv::BuiltIn::PrimitiveLineIndicesEXT:
          if (!modes || !modes->count(spv::ExecutionMode::OutputLinesEXT)) {
            return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                   << _.VkErrorID(7048)
                   << "The PrimitiveLineIndicesEXT decoration must be used "
                      "with "
                      "the OutputLinesEXT Execution Mode. ";
          }
          if (primitiveArrayDim && primitiveArrayDim != maxOutputPrimitives) {
            return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                   << _.VkErrorID(7052)
                   << "The size of the array decorated with "
                      "PrimitiveLineIndicesEXT must match the value specified "
                      "by OutputPrimitivesEXT. ";
          }
          break;
        case spv::BuiltIn::PrimitiveTriangleIndicesEXT:
          if (!modes || !modes->count(spv::ExecutionMode::OutputTrianglesEXT)) {
            return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                   << _.VkErrorID(7054)
                   << "The PrimitiveTriangleIndicesEXT decoration must be used "
                      "with "
                      "the OutputTrianglesEXT Execution Mode. ";
          }
          if (primitiveArrayDim && primitiveArrayDim != maxOutputPrimitives) {
            return _.diag(SPV_ERROR_INVALID_DATA, &inst)
                   << _.VkErrorID(7058)
                   << "The size of the array decorated with "
                      "PrimitiveTriangleIndicesEXT must match the value "
                      "specified "
                      "by OutputPrimitivesEXT. ";
          }
          break;
        default:
          break;  // no validation rules
      }
    }
  }
  // Seed at reference checks with this built-in.
  return ValidateMeshShadingEXTBuiltinsAtReference(decoration, inst, inst,
                                                   inst);
}